

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O2

void secp256k1_rangeproof_pub_expand
               (secp256k1_gej *pubs,int exp,size_t *rsizes,size_t rings,secp256k1_ge *genp)

{
  ulong uVar1;
  secp256k1_fe *rzr;
  long lVar2;
  ulong uVar3;
  secp256k1_gej *a;
  ulong uVar4;
  bool bVar5;
  secp256k1_gej base;
  secp256k1_gej tmp;
  
  if (exp < 1) {
    exp = 0;
  }
  base.infinity = genp->infinity;
  base.x.n[0] = (genp->x).n[0];
  base.x.n[1] = (genp->x).n[1];
  base.x.n[2] = (genp->x).n[2];
  base.x.n[3] = (genp->x).n[3];
  base.x.n[4] = (genp->x).n[4];
  base.y.n[0] = (genp->y).n[0];
  base.y.n[1] = (genp->y).n[1];
  base.y.n[2] = (genp->y).n[2];
  base.y.n[3] = (genp->y).n[3];
  base.y.n[4] = (genp->y).n[4];
  base.z.n[0] = 1;
  base.z.n[1] = 0;
  base.z.n[2] = 0;
  base.z.n[3] = 0;
  base.z.n[4] = 0;
  rzr = (secp256k1_fe *)rings;
  secp256k1_gej_neg(&base,&base);
  while (bVar5 = exp != 0, exp = exp + -1, bVar5) {
    secp256k1_gej_double_var(&tmp,&base,(secp256k1_fe *)0x0);
    secp256k1_gej_double_var(&base,&tmp,(secp256k1_fe *)0x0);
    secp256k1_gej_double_var(&base,&base,(secp256k1_fe *)0x0);
    secp256k1_gej_add_var(&base,&base,&tmp,rzr);
  }
  lVar2 = 0;
  for (uVar4 = 0; uVar4 != rings; uVar4 = uVar4 + 1) {
    a = pubs + lVar2;
    for (uVar3 = 1; uVar1 = rsizes[uVar4], uVar3 < uVar1; uVar3 = uVar3 + 1) {
      secp256k1_gej_add_var(a + 1,a,&base,rzr);
      a = a + 1;
    }
    if (uVar4 < rings - 1) {
      secp256k1_gej_double_var(&base,&base,(secp256k1_fe *)0x0);
      secp256k1_gej_double_var(&base,&base,(secp256k1_fe *)0x0);
      uVar1 = rsizes[uVar4];
    }
    lVar2 = lVar2 + uVar1;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_rangeproof_pub_expand(secp256k1_gej *pubs,
 int exp, size_t *rsizes, size_t rings, const secp256k1_ge* genp) {
    secp256k1_gej base;
    size_t i;
    size_t j;
    size_t npub;
    VERIFY_CHECK(exp < 19);
    if (exp < 0) {
        exp = 0;
    }
    secp256k1_gej_set_ge(&base, genp);
    secp256k1_gej_neg(&base, &base);
    while (exp--) {
        /* Multiplication by 10 */
        secp256k1_gej tmp;
        secp256k1_gej_double_var(&tmp, &base, NULL);
        secp256k1_gej_double_var(&base, &tmp, NULL);
        secp256k1_gej_double_var(&base, &base, NULL);
        secp256k1_gej_add_var(&base, &base, &tmp, NULL);
    }
    npub = 0;
    for (i = 0; i < rings; i++) {
        for (j = 1; j < rsizes[i]; j++) {
            secp256k1_gej_add_var(&pubs[npub + j], &pubs[npub + j - 1], &base, NULL);
        }
        if (i < rings - 1) {
            secp256k1_gej_double_var(&base, &base, NULL);
            secp256k1_gej_double_var(&base, &base, NULL);
        }
        npub += rsizes[i];
    }
}